

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::Variable::glslTraverseBasicTypeArray
          (string *__return_storage_ptr__,Variable *this,int numArrayElements,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  char *__rhs;
  undefined1 local_68 [8];
  VarType type;
  string traversedName;
  bool traverseAsArray;
  BasicTypeVisitFunc visit_local;
  int indentationDepth_local;
  int numArrayElements_local;
  Variable *this_local;
  
  __rhs = "";
  if (numArrayElements < 0) {
    __rhs = "[gl_InvocationID]";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&type.m_data + 8),&this->m_name,__rhs);
  if (numArrayElements < 0) {
    glu::VarType::VarType((VarType *)local_68,&this->m_type);
  }
  else {
    glu::VarType::VarType((VarType *)local_68,&this->m_type,numArrayElements);
  }
  glslTraverseBasicTypes
            (__return_storage_ptr__,(string *)((long)&type.m_data + 8),(VarType *)local_68,0,
             indentationDepth,visit);
  glu::VarType::~VarType((VarType *)local_68);
  std::__cxx11::string::~string((string *)((long)&type.m_data + 8));
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::Variable::glslTraverseBasicTypeArray (int numArrayElements, int indentationDepth, BasicTypeVisitFunc visit) const
{
	DE_ASSERT(m_isArray);

	const bool				traverseAsArray		= numArrayElements >= 0;
	const string			traversedName		= m_name + (!traverseAsArray ? "[gl_InvocationID]" : "");
	const glu::VarType		type				= traverseAsArray ? glu::VarType(m_type, numArrayElements) : m_type;

	return UserDefinedIOCase::glslTraverseBasicTypes(traversedName, type, 0, indentationDepth, visit);
}